

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<double,double,double,duckdb::BothInclusiveBetweenOperator,true,false,true>
                (double *adata,double *bdata,double *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  idx_t iVar2;
  idx_t i;
  idx_t iVar3;
  long lVar4;
  
  lVar4 = 0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar2 = iVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar2 = (idx_t)result_sel->sel_vector[iVar3];
    }
    bVar1 = BothInclusiveBetweenOperator::Operation<double>
                      ((double)cdata,(double)result_sel,1.77745995472574e-317);
    false_sel->sel_vector[lVar4] = (sel_t)iVar2;
    lVar4 = lVar4 + (ulong)!bVar1;
  }
  return count - lVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}